

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port,
                          _Bool blocking)

{
  long *plVar1;
  char cVar2;
  SessionHandle *data;
  bool bVar3;
  uint uVar4;
  _Bool _Var5;
  anon_enum_32 aVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  int iVar9;
  int iVar10;
  CHUNKcode CVar11;
  Curl_send_buffer *buff;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  ulong timeout_ms;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar15;
  byte bVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  undefined7 in_register_00000081;
  char *pcVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  bool bVar24;
  long local_b0;
  size_t local_a8;
  char *local_98;
  ssize_t gotbytes;
  uint local_88;
  curl_socket_t local_84;
  long local_80;
  ulong local_78;
  int *local_70;
  char *local_68;
  uint local_5c;
  int local_58;
  int subversion;
  char *local_50;
  ssize_t tookcareof;
  ulong local_40;
  long *local_38;
  
  subversion = 0;
  local_80 = (long)sockindex;
  aVar6 = conn->tunnel_state[local_80];
  if (aVar6 == TUNNEL_COMPLETE) {
LAB_0057f2f3:
    CVar8 = CURLE_OK;
  }
  else {
    local_88 = (uint)CONCAT71(in_register_00000081,blocking);
    uVar21 = CONCAT71(in_register_00000081,blocking) & 0xffffffff;
    data = conn->data;
    local_84 = conn->sock[local_80];
    (conn->bits).proxy_connect_closed = false;
    local_38 = &(data->info).request_size;
    local_68 = (data->state).buffer;
    local_70 = &(data->req).httpcode;
    local_78 = 0;
    bVar3 = false;
    local_b0 = 0;
    local_5c = remote_port;
    local_58 = sockindex;
    local_50 = hostname;
LAB_0057f37d:
    pcVar12 = local_50;
    uVar4 = local_5c;
    uVar23 = (uint)uVar21;
    if (aVar6 != TUNNEL_INIT) {
LAB_0057f5de:
      lVar14 = Curl_timeleft(data,(timeval *)0x0,true);
      if (lVar14 < 1) {
LAB_0057fd52:
        Curl_failf(data,"Proxy CONNECT aborted due to timeout");
        return CURLE_RECV_ERROR;
      }
      if (((char)uVar23 == '\0') && (iVar9 = Curl_socket_check(local_84,-1,-1,0), iVar9 == 0)) {
        return CURLE_OK;
      }
      bVar16 = 1;
      iVar9 = 0;
      uVar21 = 0;
      local_a8 = 0;
      local_98 = local_68;
      pcVar12 = local_68;
      do {
        bVar24 = iVar9 == 0;
        do {
          if (!(bool)((bVar16 != 0 && uVar21 < 0x4000) & bVar24)) {
            if (!bVar24) {
              return CURLE_RECV_ERROR;
            }
            if ((data->info).httpproxycode != 200) {
              CVar8 = Curl_http_auth_act(conn);
              if (CVar8 != CURLE_OK) {
                return CVar8;
              }
              if ((conn->bits).close != false) {
                bVar3 = true;
              }
            }
            lVar14 = local_80;
            uVar21 = (ulong)local_88;
            pcVar12 = (data->req).newurl;
            if (bVar3) {
              if (pcVar12 != (char *)0x0) {
                Curl_closesocket(conn,conn->sock[local_80]);
                conn->sock[lVar14] = -1;
              }
            }
            else if (pcVar12 != (char *)0x0) {
              aVar6 = conn->tunnel_state[local_80];
              if (aVar6 != TUNNEL_COMPLETE) goto LAB_0057f37d;
              conn->tunnel_state[local_80] = TUNNEL_INIT;
              Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
              if ((data->req).newurl != (char *)0x0) {
                aVar6 = conn->tunnel_state[lVar14];
                goto LAB_0057f37d;
              }
            }
            if (*local_70 == 200) {
              conn->tunnel_state[lVar14] = TUNNEL_COMPLETE;
              (*Curl_cfree)((conn->allocptr).proxyuserpwd);
              (conn->allocptr).proxyuserpwd = (char *)0x0;
              (data->state).authproxy.done = true;
              Curl_infof(data,"Proxy replied OK to CONNECT request\n");
              (data->req).ignorebody = false;
              (conn->bits).rewindaftersend = false;
              return CURLE_OK;
            }
            pcVar12 = (data->req).newurl;
            if ((bool)(bVar3 & pcVar12 != (char *)0x0)) {
              (conn->bits).proxy_connect_closed = true;
              Curl_infof(data,"Connect me again please\n");
            }
            else {
              (*Curl_cfree)(pcVar12);
              (data->req).newurl = (char *)0x0;
              (conn->bits).close = true;
              Curl_closesocket(conn,conn->sock[lVar14]);
              conn->sock[lVar14] = -1;
            }
            conn->tunnel_state[lVar14] = TUNNEL_INIT;
            if ((conn->bits).proxy_connect_closed == false) {
              Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                         (ulong)(uint)(data->req).httpcode);
              return CURLE_RECV_ERROR;
            }
            goto LAB_0057f2f3;
          }
          timeout_ms = Curl_timeleft(data,(timeval *)0x0,true);
          if ((long)timeout_ms < 1) goto LAB_0057fd52;
          if (999 < timeout_ms) {
            timeout_ms = 1000;
          }
          iVar9 = Curl_socket_check(local_84,-1,-1,timeout_ms);
          if (iVar9 == 0) goto LAB_0057f753;
          if (iVar9 == -1) {
            Curl_failf(data,"Proxy CONNECT aborted due to select/poll error");
            iVar9 = 1;
            goto LAB_0057f753;
          }
          CVar8 = Curl_read(conn,local_84,pcVar12,-(uVar21 - 0x4000),&gotbytes);
          bVar24 = true;
        } while (CVar8 == CURLE_AGAIN);
        iVar9 = 0;
        if (CVar8 == CURLE_OK) {
          if (gotbytes < 1) {
            if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
              bVar16 = 0;
              Curl_failf(data,"Proxy CONNECT aborted");
              iVar9 = 1;
            }
            else {
              (conn->bits).proxy_connect_closed = true;
              iVar9 = 0;
              Curl_infof(data,"Proxy CONNECT connection closed\n");
              bVar16 = 0;
            }
          }
          else if (bVar16 < 2) {
            local_40 = uVar21 + gotbytes;
            lVar22 = 0;
            lVar14 = gotbytes;
            do {
              local_a8 = (long)(int)local_a8 + 1;
              if (pcVar12[lVar22] == '\n') {
                if ((data->set).verbose == true) {
                  Curl_debug(data,CURLINFO_HEADER_IN,local_98,local_a8,conn);
                }
                CVar8 = Curl_client_write(conn,(data->set).include_header | 2,local_98,local_a8);
                lVar14 = local_80;
                plVar1 = &(data->info).header_size;
                *plVar1 = *plVar1 + local_a8;
                plVar1 = &(data->req).headerbytecount;
                *plVar1 = *plVar1 + local_a8;
                if (CVar8 != CURLE_OK) {
                  return CVar8;
                }
                if ((*local_98 == '\r') || (*local_98 == '\n')) {
                  if ((*local_70 == 0x197) && ((data->state).authproblem == false)) {
                    if (local_b0 == 0) {
                      if ((local_78 & 1) == 0) {
                        local_78 = 0;
                        bVar16 = 0;
                        local_b0 = 0;
                      }
                      else {
                        (data->req).ignorebody = true;
                        Curl_infof(data,"%zd bytes of chunk left\n",gotbytes - lVar22);
                        pcVar12 = local_98 + 1;
                        if (*pcVar12 == '\n') {
                          local_98 = local_98 + 1;
                        }
                        CVar11 = Curl_httpchunk_read(conn,local_98 + 1,
                                                     gotbytes -
                                                     (ulong)((uint)(*pcVar12 == '\n') + (int)lVar22)
                                                     ,&gotbytes);
                        if (CVar11 == CHUNKE_STOP) {
                          bVar16 = 0;
                          Curl_infof(data,"chunk reading DONE\n");
                          uVar15 = extraout_RAX_00;
                        }
                        else {
                          Curl_infof(data,"Read %zd bytes of chunk, continue\n",gotbytes);
                          uVar15 = 0;
                          bVar16 = 2;
                        }
                        local_78 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
                        local_b0 = 0;
                      }
                    }
                    else {
                      Curl_infof(data,"Ignore %ld bytes of response-body\n",local_b0);
                      local_b0 = (local_b0 - gotbytes) + lVar22;
                      bVar16 = (0 < local_b0) * '\x02';
                    }
                  }
                  else if (((data->info).httpproxycode == 200) &&
                          (gotbytes != (ulong)((int)lVar22 + 1))) {
                    bVar16 = 0;
                    Curl_failf(data,
                               "Proxy CONNECT followed by %zd bytes of opaque data. Data ignored (known bug #39)"
                              );
                  }
                  else {
                    bVar16 = 0;
                  }
                  conn->tunnel_state[lVar14] = TUNNEL_COMPLETE;
                  goto LAB_0057fb8c;
                }
                cVar2 = local_98[local_a8];
                local_98[local_a8] = '\0';
                iVar10 = Curl_raw_nequal("WWW-Authenticate:",local_98,0x11);
                if ((iVar10 == 0) || (*local_70 != 0x191)) {
                  iVar10 = Curl_raw_nequal("Proxy-authenticate:",local_98,0x13);
                  if ((iVar10 != 0) && (_Var5 = true, *local_70 == 0x197)) goto LAB_0057f89f;
                  iVar10 = Curl_raw_nequal("Content-Length:",local_98,0xf);
                  if (iVar10 == 0) {
                    _Var5 = Curl_compareheader(local_98,"Connection:","close");
                    if (_Var5) {
                      bVar3 = true;
                    }
                    else {
                      _Var5 = Curl_compareheader(local_98,"Transfer-Encoding:","chunked");
                      if (_Var5) {
                        Curl_infof(data,"CONNECT responded chunked\n");
                        Curl_httpchunk_init(conn);
                        local_78 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                      }
                      else {
                        _Var5 = Curl_compareheader(local_98,"Proxy-Connection:","close");
                        if (_Var5) {
                          bVar3 = true;
                        }
                        else {
                          iVar10 = __isoc99_sscanf(local_98,"HTTP/1.%d %d",&subversion,local_70);
                          if (iVar10 == 2) {
                            (data->info).httpproxycode = (data->req).httpcode;
                          }
                        }
                      }
                    }
                  }
                  else {
                    local_b0 = strtol(local_98 + 0xf,(char **)0x0,10);
                  }
                }
                else {
                  _Var5 = false;
LAB_0057f89f:
                  pcVar18 = Curl_copy_header_value(local_98);
                  if (pcVar18 == (char *)0x0) {
                    return CURLE_OUT_OF_MEMORY;
                  }
                  CVar8 = Curl_http_input_auth(conn,_Var5,pcVar18);
                  (*Curl_cfree)(pcVar18);
                  if (CVar8 != CURLE_OK) {
                    return CVar8;
                  }
                }
                local_98[local_a8] = cVar2;
                local_98 = pcVar12 + lVar22 + 1;
                local_a8 = 0;
                lVar14 = gotbytes;
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < lVar14);
            pcVar12 = pcVar12 + lVar22;
            uVar21 = local_40;
          }
          else if (local_b0 == 0) {
            tookcareof = 0;
            CVar11 = Curl_httpchunk_read(conn,local_68,gotbytes,&tookcareof);
            if (CVar11 == CHUNKE_STOP) {
              bVar16 = 0;
              Curl_infof(data,"chunk reading DONE\n");
              conn->tunnel_state[local_80] = TUNNEL_COMPLETE;
            }
            else {
              Curl_infof(data,"Read %zd bytes of chunk, continue\n",tookcareof);
            }
            iVar9 = 0;
            local_b0 = 0;
            pcVar12 = local_68;
            uVar21 = 0;
          }
          else {
            lVar14 = local_b0 - gotbytes;
            bVar24 = local_b0 < gotbytes;
            local_b0 = lVar14;
            if (lVar14 == 0 || bVar24) {
              bVar16 = 0;
            }
LAB_0057fb8c:
            iVar9 = 0;
            pcVar12 = local_68;
            uVar21 = 0;
          }
        }
        else {
          bVar16 = 0;
        }
LAB_0057f753:
        iVar10 = Curl_pgrsUpdate(conn);
        if (iVar10 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
      } while( true );
    }
    Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_50,(ulong)local_5c);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    buff = Curl_add_buffer_init();
    CVar8 = CURLE_OUT_OF_MEMORY;
    if (buff != (Curl_send_buffer *)0x0) {
      pcVar12 = curl_maprintf("%s:%hu",pcVar12,(ulong)uVar4);
      if (pcVar12 != (char *)0x0) {
        CVar7 = Curl_http_output_auth(conn,"CONNECT",pcVar12,true);
        (*Curl_cfree)(pcVar12);
        if (CVar7 != CURLE_OK) {
          Curl_add_buffer_free(buff);
          return CVar7;
        }
        pcVar12 = "1.1";
        if (conn->proxytype == CURLPROXY_HTTP_1_0) {
          pcVar12 = "1.0";
        }
        bVar24 = (conn->bits).ipv6_ip != false;
        pcVar18 = "";
        pcVar19 = "";
        if (bVar24) {
          pcVar19 = "[";
        }
        pcVar17 = "";
        if (bVar24) {
          pcVar17 = "]";
        }
        pcVar19 = curl_maprintf("%s%s%s:%hu",pcVar19,local_50,pcVar17,(ulong)local_5c);
        if (pcVar19 != (char *)0x0) {
          pcVar17 = Curl_checkProxyheaders(conn,"Host:");
          if ((pcVar17 == (char *)0x0) &&
             (pcVar18 = curl_maprintf("Host: %s\r\n",pcVar19), pcVar18 == (char *)0x0)) {
            (*Curl_cfree)(pcVar19);
          }
          else {
            pcVar17 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
            pcVar20 = "";
            if (pcVar17 == (char *)0x0) {
              pcVar20 = "Proxy-Connection: Keep-Alive\r\n";
            }
            pcVar13 = Curl_checkProxyheaders(conn,"User-Agent:");
            pcVar17 = "";
            if ((pcVar13 == (char *)0x0) && (pcVar17 = "", (data->set).str[0x19] != (char *)0x0)) {
              pcVar17 = (conn->allocptr).uagent;
            }
            pcVar13 = (conn->allocptr).proxyuserpwd;
            if (pcVar13 == (char *)0x0) {
              pcVar13 = "";
            }
            CVar8 = Curl_add_bufferf(buff,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar19,pcVar12,pcVar18,
                                     pcVar13,pcVar17,pcVar20);
            if (*pcVar18 != '\0') {
              (*Curl_cfree)(pcVar18);
            }
            (*Curl_cfree)(pcVar19);
            uVar23 = local_88;
            if ((((CVar8 == CURLE_OK) &&
                 (CVar8 = Curl_add_custom_headers(conn,true,buff), CVar8 == CURLE_OK)) &&
                (CVar8 = Curl_add_bufferf(buff,"\r\n"), CVar8 == CURLE_OK)) &&
               (CVar8 = Curl_add_buffer_send(buff,conn,local_38,0,local_58), CVar8 == CURLE_OK)) {
              Curl_add_buffer_free((Curl_send_buffer *)0x0);
              conn->tunnel_state[local_80] = TUNNEL_CONNECT;
              goto LAB_0057f5de;
            }
            Curl_failf(data,"Failed sending CONNECT to proxy");
            buff = (Curl_send_buffer *)0x0;
          }
        }
      }
      Curl_add_buffer_free(buff);
    }
  }
  return CVar8;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port,
                           bool blocking)
{
  int subversion=0;
  struct SessionHandle *data=conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  curl_off_t cl=0;
  bool closeConnection = FALSE;
  bool chunked_encoding = FALSE;
  long check;

#define SELECT_OK      0
#define SELECT_ERROR   1
#define SELECT_TIMEOUT 2
  int error = SELECT_OK;

  if(conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%hu\n",
            hostname, remote_port);

        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
      free(data->req.newurl);
      data->req.newurl = NULL;

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%hu", hostname, remote_port);
      if(!host_port) {
        Curl_add_buffer_free(req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(!result) {
        char *host=(char *)"";
        const char *proxyconn="";
        const char *useragent="";
        const char *http = (conn->proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        char *hostheader= /* host:port with IPv6 support */
          aprintf("%s%s%s:%hu", conn->bits.ipv6_ip?"[":"",
                  hostname, conn->bits.ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          Curl_add_buffer_free(req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host:")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            Curl_add_buffer_free(req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection:"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent:") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host,
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host && *host)
          free(host);
        free(hostheader);

        if(!result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(!result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(req_buffer, "\r\n");

        if(!result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_add_buffer_free(req_buffer);
      if(result)
        return result;

      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_RECV_ERROR;
    }

    if(!blocking) {
      if(0 == Curl_socket_ready(tunnelsocket, CURL_SOCKET_BAD, 0))
        /* return so we'll be called again polling-style */
        return CURLE_OK;
      else {
        DEBUGF(infof(data,
               "Read response immediately from proxy CONNECT\n"));
      }
    }

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      size_t nread;   /* total size read */
      int perline; /* count bytes per line */
      int keepon=TRUE;
      ssize_t gotbytes;
      char *ptr;
      char *line_start;

      ptr=data->state.buffer;
      line_start = ptr;

      nread=0;
      perline=0;

      while((nread<BUFSIZE) && (keepon && !error)) {

        check = Curl_timeleft(data, NULL, TRUE);
        if(check <= 0) {
          failf(data, "Proxy CONNECT aborted due to timeout");
          error = SELECT_TIMEOUT; /* already too little time */
          break;
        }

        /* loop every second at least, less if the timeout is near */
        switch (Curl_socket_ready(tunnelsocket, CURL_SOCKET_BAD,
                                  check<1000L?check:1000)) {
        case -1: /* select() error, stop reading */
          error = SELECT_ERROR;
          failf(data, "Proxy CONNECT aborted due to select/poll error");
          break;
        case 0: /* timeout */
          break;
        default:
          DEBUGASSERT(ptr+BUFSIZE-nread <= data->state.buffer+BUFSIZE+1);
          result = Curl_read(conn, tunnelsocket, ptr, BUFSIZE-nread,
                             &gotbytes);
          if(result==CURLE_AGAIN)
            continue; /* go loop yourself */
          else if(result)
            keepon = FALSE;
          else if(gotbytes <= 0) {
            keepon = FALSE;
            if(data->set.proxyauth && data->state.authproxy.avail) {
              /* proxy auth was requested and there was proxy auth available,
                 then deem this as "mere" proxy disconnect */
              conn->bits.proxy_connect_closed = TRUE;
              infof(data, "Proxy CONNECT connection closed\n");
            }
            else {
              error = SELECT_ERROR;
              failf(data, "Proxy CONNECT aborted");
            }
          }
          else {
            /*
             * We got a whole chunk of data, which can be anything from one
             * byte to a set of lines and possibly just a piece of the last
             * line.
             */
            int i;

            nread += gotbytes;

            if(keepon > TRUE) {
              /* This means we are currently ignoring a response-body */

              nread = 0; /* make next read start over in the read buffer */
              ptr=data->state.buffer;
              if(cl) {
                /* A Content-Length based body: simply count down the counter
                   and make sure to break out of the loop when we're done! */
                cl -= gotbytes;
                if(cl<=0) {
                  keepon = FALSE;
                  break;
                }
              }
              else {
                /* chunked-encoded body, so we need to do the chunked dance
                   properly to know when the end of the body is reached */
                CHUNKcode r;
                ssize_t tookcareof=0;

                /* now parse the chunked piece of data so that we can
                   properly tell when the stream ends */
                r = Curl_httpchunk_read(conn, ptr, gotbytes, &tookcareof);
                if(r == CHUNKE_STOP) {
                  /* we're done reading chunks! */
                  infof(data, "chunk reading DONE\n");
                  keepon = FALSE;
                  /* we did the full CONNECT treatment, go COMPLETE */
                  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                }
                else
                  infof(data, "Read %zd bytes of chunk, continue\n",
                        tookcareof);
              }
            }
            else
              for(i = 0; i < gotbytes; ptr++, i++) {
                perline++; /* amount of bytes in this line so far */
                if(*ptr == 0x0a) {
                  char letter;
                  int writetype;

                  /* convert from the network encoding */
                  result = Curl_convert_from_network(data, line_start,
                                                     perline);
                  /* Curl_convert_from_network calls failf if unsuccessful */
                  if(result)
                    return result;

                  /* output debug if that is requested */
                  if(data->set.verbose)
                    Curl_debug(data, CURLINFO_HEADER_IN,
                               line_start, (size_t)perline, conn);

                  /* send the header to the callback */
                  writetype = CLIENTWRITE_HEADER;
                  if(data->set.include_header)
                    writetype |= CLIENTWRITE_BODY;

                  result = Curl_client_write(conn, writetype, line_start,
                                             perline);

                  data->info.header_size += (long)perline;
                  data->req.headerbytecount += (long)perline;

                  if(result)
                    return result;

                  /* Newlines are CRLF, so the CR is ignored as the line isn't
                     really terminated until the LF comes. Treat a following CR
                     as end-of-headers as well.*/

                  if(('\r' == line_start[0]) ||
                     ('\n' == line_start[0])) {
                    /* end of response-headers from the proxy */
                    nread = 0; /* make next read start over in the read
                                  buffer */
                    ptr=data->state.buffer;
                    if((407 == k->httpcode) && !data->state.authproblem) {
                      /* If we get a 407 response code with content length
                         when we have no auth problem, we must ignore the
                         whole response-body */
                      keepon = 2;

                      if(cl) {
                        infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                              " bytes of response-body\n", cl);

                        /* remove the remaining chunk of what we already
                           read */
                        cl -= (gotbytes - i);

                        if(cl<=0)
                          /* if the whole thing was already read, we are done!
                           */
                          keepon=FALSE;
                      }
                      else if(chunked_encoding) {
                        CHUNKcode r;
                        /* We set ignorebody true here since the chunked
                           decoder function will acknowledge that. Pay
                           attention so that this is cleared again when this
                           function returns! */
                        k->ignorebody = TRUE;
                        infof(data, "%zd bytes of chunk left\n", gotbytes-i);

                        if(line_start[1] == '\n') {
                          /* this can only be a LF if the letter at index 0
                             was a CR */
                          line_start++;
                          i++;
                        }

                        /* now parse the chunked piece of data so that we can
                           properly tell when the stream ends */
                        r = Curl_httpchunk_read(conn, line_start+1,
                                                  gotbytes -i, &gotbytes);
                        if(r == CHUNKE_STOP) {
                          /* we're done reading chunks! */
                          infof(data, "chunk reading DONE\n");
                          keepon = FALSE;
                          /* we did the full CONNECT treatment, go to
                             COMPLETE */
                          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                        }
                        else
                          infof(data, "Read %zd bytes of chunk, continue\n",
                                gotbytes);
                      }
                      else {
                        /* without content-length or chunked encoding, we
                           can't keep the connection alive since the close is
                           the end signal so we bail out at once instead */
                        keepon=FALSE;
                      }
                    }
                    else {
                      keepon = FALSE;
                      if(200 == data->info.httpproxycode) {
                        if(gotbytes - (i+1))
                          failf(data, "Proxy CONNECT followed by %zd bytes "
                                "of opaque data. Data ignored (known bug #39)",
                                gotbytes - (i+1));
                      }
                    }
                    /* we did the full CONNECT treatment, go to COMPLETE */
                    conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                    break; /* breaks out of for-loop, not switch() */
                  }

                  /* keep a backup of the position we are about to blank */
                  letter = line_start[perline];
                  line_start[perline]=0; /* zero terminate the buffer */
                  if((checkprefix("WWW-Authenticate:", line_start) &&
                      (401 == k->httpcode)) ||
                     (checkprefix("Proxy-authenticate:", line_start) &&
                      (407 == k->httpcode))) {

                    bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
                    char *auth = Curl_copy_header_value(line_start);
                    if(!auth)
                      return CURLE_OUT_OF_MEMORY;

                    result = Curl_http_input_auth(conn, proxy, auth);

                    free(auth);

                    if(result)
                      return result;
                  }
                  else if(checkprefix("Content-Length:", line_start)) {
                    cl = curlx_strtoofft(line_start +
                                         strlen("Content-Length:"), NULL, 10);
                  }
                  else if(Curl_compareheader(line_start,
                                             "Connection:", "close"))
                    closeConnection = TRUE;
                  else if(Curl_compareheader(line_start,
                                             "Transfer-Encoding:",
                                             "chunked")) {
                    infof(data, "CONNECT responded chunked\n");
                    chunked_encoding = TRUE;
                    /* init our chunky engine */
                    Curl_httpchunk_init(conn);
                  }
                  else if(Curl_compareheader(line_start,
                                             "Proxy-Connection:", "close"))
                    closeConnection = TRUE;
                  else if(2 == sscanf(line_start, "HTTP/1.%d %d",
                                      &subversion,
                                      &k->httpcode)) {
                    /* store the HTTP code from the proxy */
                    data->info.httpproxycode = k->httpcode;
                  }
                  /* put back the letter we blanked out before */
                  line_start[perline]= letter;

                  perline=0; /* line starts over here */
                  line_start = ptr+1; /* this skips the zero byte we wrote */
                }
              }
          }
          break;
        } /* switch */
        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;
      } /* while there's buffer left and loop is requested */

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode != 200) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below
          */
          closeConnection = TRUE;
      }

      if(closeConnection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl &&
       (TUNNEL_COMPLETE == conn->tunnel_state[sockindex])) {
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      infof(data, "TUNNEL_STATE switched to: %d\n",
            conn->tunnel_state[sockindex]);
    }

  } while(data->req.newurl);

  if(200 != data->req.httpcode) {
    if(closeConnection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
    }
    else {
      free(data->req.newurl);
      data->req.newurl = NULL;
      /* failure, close this connection to avoid re-use */
      connclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    conn->tunnel_state[sockindex] = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    else {
      failf(data, "Received HTTP code %d from proxy after CONNECT",
            data->req.httpcode);
      return CURLE_RECV_ERROR;
    }
  }

  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;

  infof (data, "Proxy replied OK to CONNECT request\n");
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}